

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

UninterpretedOption *
google::protobuf::Arena::CreateMaybeMessage<google::protobuf::UninterpretedOption>(Arena *arena)

{
  UninterpretedOption *this;
  
  if (arena == (Arena *)0x0) {
    this = (UninterpretedOption *)operator_new(0x60);
    UninterpretedOption::UninterpretedOption(this,(Arena *)0x0);
  }
  else {
    if (arena->hooks_cookie_ != (void *)0x0) {
      OnArenaAllocation(arena,(type_info *)&UninterpretedOption::typeinfo,0x60);
    }
    this = (UninterpretedOption *)AllocateAlignedNoHook(arena,0x60);
    UninterpretedOption::UninterpretedOption(this,arena);
  }
  return this;
}

Assistant:

PROTOBUF_NOINLINE PROTOBUF_NAMESPACE_ID::UninterpretedOption* Arena::CreateMaybeMessage< PROTOBUF_NAMESPACE_ID::UninterpretedOption >(Arena* arena) {
  return Arena::CreateMessageInternal< PROTOBUF_NAMESPACE_ID::UninterpretedOption >(arena);
}